

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_lite_unittest.pb.cc
# Opt level: O2

size_t __thiscall proto2_unittest::TestMessageMapLite::ByteSizeLong(TestMessageMapLite *this)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  const_iterator __begin2;
  UntypedMapIterator local_30;
  
  sVar3 = (size_t)*(uint *)&this->field_0;
  google::protobuf::internal::UntypedMapBase::begin
            (&local_30,(UntypedMapBase *)&(this->field_0)._impl_);
  while (local_30.node_ != (NodeBase *)0x0) {
    sVar2 = google::protobuf::internal::
            MapEntryFuncs<int,_proto2_unittest::TestAllTypesLite,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            ::ByteSizeLong((int *)(local_30.node_ + 1),(TestAllTypesLite *)(local_30.node_ + 2));
    sVar3 = sVar3 + sVar2;
    google::protobuf::internal::UntypedMapIterator::PlusPlus(&local_30);
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    sVar3 = sVar3 + *(long *)((uVar1 & 0xfffffffffffffffe) + 0x10);
  }
  if (((int)sVar3 != 0) || ((this->field_0)._impl_._cached_size_.atom_ != 0)) {
    (this->field_0)._impl_._cached_size_.atom_ = (int)sVar3;
  }
  return sVar3;
}

Assistant:

::size_t TestMessageMapLite::ByteSizeLong() const {
  const TestMessageMapLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestMessageMapLite)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // map<int32, .proto2_unittest.TestAllTypesLite> map_int32_message = 1;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_map_int32_message_size());
      for (const auto& entry : this_._internal_map_int32_message()) {
        total_size += _pbi::MapEntryFuncs<::int32_t, ::proto2_unittest::TestAllTypesLite,
                                       _pbi::WireFormatLite::TYPE_INT32,
                                       _pbi::WireFormatLite::TYPE_MESSAGE>::ByteSizeLong(entry.first, entry.second);
      }
    }
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}